

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O2

void __thiscall QWidgetAction::~QWidgetAction(QWidgetAction *this)

{
  Function slot;
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007c6440;
  slot = *(Function *)&this->field_0x8;
  lVar1 = *(long *)(slot + 0x1c0);
  lVar2 = *(long *)(slot + 0x1c8);
  for (lVar3 = 0; lVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QWidgetActionPrivate::*)(QObject*)>
              (*(Object **)(lVar1 + lVar3),(offset_in_QObject_to_subr)QObject::destroyed,
               (Object *)0x0,slot);
  }
  local_50.d = *(Data **)(slot + 0x1b8);
  local_50.ptr = *(QWidget ***)(slot + 0x1c0);
  local_50.size = *(qsizetype *)(slot + 0x1c8);
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QList<QWidget_*>::clear((QList<QWidget_*> *)(slot + 0x1b8));
  qDeleteAll<QList<QWidget*>>((QList<QWidget_*> *)&local_50);
  if (((*(long *)(slot + 0x1a8) != 0) && (*(int *)(*(long *)(slot + 0x1a8) + 4) != 0)) &&
     (*(long **)(slot + 0x1b0) != (long *)0x0)) {
    (**(code **)(**(long **)(slot + 0x1b0) + 0x20))();
  }
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_50);
  QAction::~QAction(&this->super_QAction);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetAction::~QWidgetAction()
{
    Q_D(QWidgetAction);
    for (QWidget *w : std::as_const(d->createdWidgets))
        QObjectPrivate::disconnect(w, &QWidget::destroyed,
                                   d, &QWidgetActionPrivate::widgetDestroyed);
    QList<QWidget *> widgetsToDelete = d->createdWidgets;
    d->createdWidgets.clear();
    qDeleteAll(widgetsToDelete);
    delete d->defaultWidget;
}